

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acceptor.cpp
# Opt level: O2

result<sockpp::acceptor> *
sockpp::acceptor::create(result<sockpp::acceptor> *__return_storage_ptr__,int domain)

{
  int in_ECX;
  int __type;
  socket *psVar1;
  result<int> res;
  result<int> local_38;
  socket local_20;
  
  create_handle(&local_38,domain);
  if (local_38.err_._M_value == 0) {
    local_20.handle_ = local_38.val_;
    local_20._vptr_socket = (_func_int **)&PTR__socket_0010da00;
    psVar1 = &local_20;
    result<sockpp::acceptor>::result(__return_storage_ptr__,(acceptor *)&local_20);
    socket::~socket(&local_20,(int)psVar1,__type,in_ECX);
  }
  else {
    (__return_storage_ptr__->val_).super_socket.handle_ = -1;
    (__return_storage_ptr__->val_).super_socket._vptr_socket = (_func_int **)&PTR__socket_0010da00;
    *(ulong *)&__return_storage_ptr__->err_ = CONCAT44(local_38.err_._4_4_,local_38.err_._M_value);
    (__return_storage_ptr__->err_)._M_cat = local_38.err_._M_cat;
  }
  return __return_storage_ptr__;
}

Assistant:

result<acceptor> acceptor::create(int domain) noexcept {
    if (auto res = create_handle(domain); !res)
        return res.error();
    else
        return acceptor(res.value());
}